

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptSymbol::GetDiagValueString
          (JavascriptSymbol *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  uint uVar1;
  PropertyRecord *pPVar2;
  uint countNeeded;
  
  if ((this->propertyRecordUsageCache).propertyRecord.ptr != (PropertyRecord *)0x0) {
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<8ul>
              (stringBuilder,(char16 (*) [8])L"Symbol(");
    pPVar2 = (this->propertyRecordUsageCache).propertyRecord.ptr;
    uVar1 = pPVar2->byteCount;
    countNeeded = uVar1 >> 1;
    StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,countNeeded);
    JavascriptString::CopyHelper(stringBuilder->appendPtr,(char16 *)(pPVar2 + 1),countNeeded);
    stringBuilder->appendPtr =
         (char16 *)((long)stringBuilder->appendPtr + (ulong)(uVar1 & 0xfffffffe));
    stringBuilder->count = stringBuilder->count + countNeeded;
    StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L')');
  }
  return 1;
}

Assistant:

BOOL JavascriptSymbol::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        if (this->GetValue())
        {
            stringBuilder->AppendCppLiteral(_u("Symbol("));
            stringBuilder->Append(this->GetValue()->GetBuffer(), this->GetValue()->GetLength());
            stringBuilder->Append(_u(')'));
        }
        return TRUE;
    }